

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmon.cpp
# Opt level: O3

void __thiscall memmon::get_hardware_info(memmon *this,json *hw_json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  pointer pcVar3;
  json_value jVar4;
  char *__nptr;
  pointer pbVar5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  long lVar9;
  int *piVar10;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  reference pvVar11;
  undefined8 uVar12;
  pointer pbVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string line;
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  metrics;
  ifstream memInfoFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  long local_2f0;
  char local_2e8 [16];
  char *local_2d8;
  undefined8 local_2d0;
  char local_2c8 [16];
  data local_2b8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_2a0;
  char *local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  key_type local_278;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  long local_238 [65];
  
  local_2a0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)hw_json;
  std::ifstream::ifstream(local_238,"/proc/meminfo",_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  paVar1 = &local_318.field_2;
  local_318._M_dataplus._M_p = (pointer)paVar1;
  if (cVar6 == '\0') {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_318,"Failed to open /proc/meminfo","");
    MessageBase::error(&this->super_MessageBase,&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"MemTotal","");
    __l._M_len = 1;
    __l._M_array = &local_318;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_290,__l,(allocator_type *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_318._M_string_length = 0;
    local_318.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_318,cVar6);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      if ((string *)local_318._M_string_length != (string *)0x0) {
        lVar9 = std::__cxx11::string::find((char *)&local_318,0x193f86,0);
        local_2f0 = 0;
        local_2e8[0] = '\0';
        local_2f8._M_current = local_2e8;
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&local_318);
          std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_2d8);
          if (local_2d8 != local_2c8) {
            operator_delete(local_2d8);
          }
          pbVar5 = local_290.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar13 = local_290.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_2f0 != 0) {
            while( true ) {
              if (pbVar13 == pbVar5) break;
              if (((string *)pbVar13->_M_string_length <= local_318._M_string_length) &&
                 (iVar7 = std::__cxx11::string::compare
                                    ((ulong)&local_318,0,(string *)pbVar13->_M_string_length),
                 iVar7 == 0)) {
                std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&local_2f8);
                std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_2d8);
                if (local_2d8 != local_2c8) {
                  operator_delete(local_2d8);
                }
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&local_258,"^\\s+|\\s+$",0x10);
                local_2d0 = 0;
                local_2c8[0] = '\0';
                local_2d8 = local_2c8;
                std::
                __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2d8,local_2f8,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_2f8._M_current + local_2f0),&local_258,"",0,0);
                __nptr = local_2d8;
                piVar10 = __errno_location();
                iVar7 = *piVar10;
                *piVar10 = 0;
                lVar9 = strtol(__nptr,&local_298,10);
                if (local_298 == __nptr) {
                  std::__throw_invalid_argument("stol");
LAB_0018e2eb:
                  uVar12 = std::__throw_out_of_range("stol");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._M_dataplus._M_p != &local_318.field_2) {
                    operator_delete(local_318._M_dataplus._M_p);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_290);
                  std::ifstream::~ifstream(local_238);
                  _Unwind_Resume(uVar12);
                }
                if (*piVar10 == 0) {
                  *piVar10 = iVar7;
                }
                else if (*piVar10 == 0x22) goto LAB_0018e2eb;
                local_2b8.m_type = null;
                local_2b8._1_7_ = 0;
                local_2b8.m_value.object = (object_t *)0x0;
                nlohmann::json_abi_v3_11_3::detail::
                external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
                construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2b8,lVar9);
                this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(local_2a0,"HW");
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(this_00,"mem");
                pcVar3 = (pbVar13->_M_dataplus)._M_p;
                local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_278,pcVar3,pcVar3 + pbVar13->_M_string_length);
                pvVar11 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](pvVar11,&local_278);
                vVar2 = (pvVar11->m_data).m_type;
                (pvVar11->m_data).m_type = local_2b8.m_type;
                local_2b8.m_type = vVar2;
                jVar4 = (pvVar11->m_data).m_value;
                (pvVar11->m_data).m_value = local_2b8.m_value;
                local_2b8.m_value = jVar4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p);
                }
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_2b8);
                if (local_2d8 != local_2c8) {
                  operator_delete(local_2d8);
                }
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          (&local_258);
              }
              pbVar13 = pbVar13 + 1;
            }
          }
        }
        if (local_2f8._M_current != local_2e8) {
          operator_delete(local_2f8._M_current);
        }
      }
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void const memmon::get_hardware_info(nlohmann::json& hw_json) {
  // Read some information from /proc/meminfo
  std::ifstream memInfoFile{"/proc/meminfo"};
  if (!memInfoFile.is_open()) {
    error("Failed to open /proc/meminfo");
    return;
  }

  // Metrics to read from the input
  std::vector<std::string> metrics{"MemTotal"};

  // Loop over the file
  std::string line;
  while (std::getline(memInfoFile, line)) {
    if (line.empty()) continue;
    size_t splitIdx = line.find(":");
    std::string val;
    if (splitIdx != std::string::npos) {
      val = line.substr(splitIdx + 1);
      if (val.empty()) continue;
      for (const auto& metric : metrics) {
        if (line.size() >= metric.size() &&
            line.compare(0, metric.size(), metric) == 0) {
          val = val.substr(0, val.size() - 3);  // strip the trailing kB
          hw_json["HW"]["mem"][metric] =
              std::stol(std::regex_replace(val, std::regex("^\\s+|\\s+$"), ""));
        }  // end of metric check
      }    // end of populating metrics
    }      // end of seperator check
  }        // end of reading memInfoFile

  // Close the file
  memInfoFile.close();

  return;
}